

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay_estimator_wrapper.cc
# Opt level: O3

void * WebRtc_CreateDelayEstimator(void *farend_handle,int max_lookahead)

{
  int iVar1;
  undefined8 *handle;
  BinaryDelayEstimator *pBVar2;
  void *pvVar3;
  
  if ((farend_handle != (void *)0x0) &&
     (handle = (undefined8 *)malloc(0x18), handle != (undefined8 *)0x0)) {
    pBVar2 = WebRtc_CreateBinaryDelayEstimator
                       (*(BinaryDelayEstimatorFarend **)((long)farend_handle + 0x10),max_lookahead);
    handle[2] = pBVar2;
    iVar1 = *(int *)((long)farend_handle + 0xc);
    pvVar3 = malloc((long)iVar1 * 4);
    *handle = pvVar3;
    *(int *)((long)handle + 0xc) = iVar1;
    if ((pBVar2 != (BinaryDelayEstimator *)0x0) && (pvVar3 != (void *)0x0)) {
      return handle;
    }
    WebRtc_FreeDelayEstimator(handle);
  }
  return (void *)0x0;
}

Assistant:

void* WebRtc_CreateDelayEstimator(void* farend_handle, int max_lookahead) {
  DelayEstimator* self = NULL;
  DelayEstimatorFarend* farend = (DelayEstimatorFarend*) farend_handle;

  if (farend_handle != NULL) {
    self = static_cast<DelayEstimator*>(malloc(sizeof(DelayEstimator)));
  }

  if (self != NULL) {
    int memory_fail = 0;

    // Allocate memory for the farend spectrum handling.
    self->binary_handle =
        WebRtc_CreateBinaryDelayEstimator(farend->binary_farend, max_lookahead);
    memory_fail |= (self->binary_handle == NULL);

    // Allocate memory for spectrum buffers.
    self->mean_near_spectrum = static_cast<SpectrumType*>(
        malloc(farend->spectrum_size * sizeof(SpectrumType)));
    memory_fail |= (self->mean_near_spectrum == NULL);

    self->spectrum_size = farend->spectrum_size;

    if (memory_fail) {
      WebRtc_FreeDelayEstimator(self);
      self = NULL;
    }
  }

  return self;
}